

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.hh
# Opt level: O3

void __thiscall
tinyusdz::tydra::TerminalAttributeValue::~TerminalAttributeValue(TerminalAttributeValue *this)

{
  vtable_type *pvVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  AttrMetas::~AttrMetas(&this->_meta);
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    (*pvVar1->destroy)((storage_union *)&this->_value);
    (this->_value).v_.vtable = (vtable_type *)0x0;
  }
  pcVar2 = (this->_type_name)._M_dataplus._M_p;
  paVar3 = &(this->_type_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TerminalAttributeValue() = default;